

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::JunitReporter::writeAssertion(JunitReporter *this,AssertionStats *stats)

{
  AssertionResult *this_00;
  pointer pbVar1;
  OfType OVar2;
  _Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  os;
  pointer pcVar3;
  pointer pMVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar8;
  size_t sVar9;
  char *pcVar10;
  XmlWriter *this_01;
  MessageInfo *msg;
  pointer pMVar11;
  long in_FS_OFFSET;
  ReusableStringStream rss;
  ScopedElement e;
  string elementName;
  char local_d1;
  ReusableStringStream local_d0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78 [32];
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  OVar2 = (stats->assertionResult).m_resultData.resultType;
  if (((OVar2 & FailureBit) == Ok) ||
     (((stats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)) goto LAB_00173dcc;
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = 0;
  pcVar10 = "failure";
  if (OVar2 < Exception) {
    uVar7 = OVar2 + Info;
    if (uVar7 < 0x14) {
      if ((0x2000fU >> (uVar7 & 0x1f) & 1) != 0) {
LAB_001739dc:
        pcVar10 = "internalError";
        goto LAB_00173a29;
      }
      if ((0xc0000U >> (uVar7 & 0x1f) & 1) != 0) goto LAB_00173a29;
    }
  }
  else if (OVar2 < DidntThrowException) {
    if (OVar2 == Exception) goto LAB_001739dc;
    if (OVar2 == ThrewException) {
LAB_00173a10:
      pcVar10 = "error";
      goto LAB_00173a29;
    }
  }
  else if (OVar2 == DidntThrowException) {
LAB_00173a29:
    std::__cxx11::string::_M_replace((ulong)&local_58,0,(char *)0x0,(ulong)pcVar10);
  }
  else if (OVar2 == FatalErrorCondition) goto LAB_00173a10;
  this_01 = &this->xml;
  XmlWriter::scopedElement((XmlWriter *)local_b8,(string *)this_01,(XmlFormatting)&local_58);
  pbVar1 = (pointer)(local_a8 + 0x10);
  local_a8._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"message","");
  this_00 = &stats->assertionResult;
  AssertionResult::getExpression_abi_cxx11_((string *)local_78,this_00);
  XmlWriter::writeAttribute(this_01,(string *)local_a8,(string *)local_78);
  if ((ostream *)local_78._0_8_ != (ostream *)(local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_);
  }
  if ((pointer)local_a8._0_8_ != pbVar1) {
    operator_delete((void *)local_a8._0_8_);
  }
  local_a8._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"type","");
  local_78._0_8_ = (stats->assertionResult).m_info.macroName.m_start;
  local_78._8_8_ = (stats->assertionResult).m_info.macroName.m_size;
  XmlWriter::writeAttribute<Catch::StringRef>(this_01,(string *)local_a8,(StringRef *)local_78);
  if ((pointer)local_a8._0_8_ != pbVar1) {
    operator_delete((void *)local_a8._0_8_);
  }
  local_d0.super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_001cd308;
  pSVar8 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar9 = StringStreams::add(&pSVar8->super_StringStreams);
  local_d0.m_index = sVar9;
  pSVar8 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  os._M_head_impl =
       *(basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
        &(pSVar8->super_StringStreams).m_streams.
         super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[sVar9]._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  local_d0.m_oss = (ostream *)os._M_head_impl;
  if ((stats->totals).assertions.failed + (stats->totals).assertions.passed +
      (stats->totals).assertions.failedButOk == 0) {
    local_a8[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os._M_head_impl,local_a8,1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os._M_head_impl,"FAILED",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os._M_head_impl,":\n",2);
    if ((stats->assertionResult).m_info.capturedExpression.m_size != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os._M_head_impl,"  ",2);
      AssertionResult::getExpressionInMacro_abi_cxx11_((string *)local_a8,this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os._M_head_impl,(char *)local_a8._0_8_,local_a8._8_8_);
      if ((pointer)local_a8._0_8_ != pbVar1) {
        operator_delete((void *)local_a8._0_8_);
      }
      local_a8[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os._M_head_impl,local_a8,1);
    }
    bVar6 = AssertionResult::hasExpandedExpression(this_00);
    if (bVar6) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os._M_head_impl,"with expansion:\n",0x10);
      AssertionResult::getExpandedExpression_abi_cxx11_((string *)local_78,this_00);
      clara::TextFlow::Column::Column((Column *)local_a8,(string *)local_78);
      local_88._M_allocated_capacity = 2;
      clara::TextFlow::operator<<((ostream *)os._M_head_impl,(Column *)local_a8);
      local_d1 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os._M_head_impl,&local_d1,1);
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8);
      if ((ostream *)local_78._0_8_ != (ostream *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_);
      }
    }
  }
  pcVar3 = (stats->assertionResult).m_resultData.message._M_dataplus._M_p;
  local_a8._0_8_ = pbVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,pcVar3,
             pcVar3 + (stats->assertionResult).m_resultData.message._M_string_length);
  uVar5 = local_a8._8_8_;
  if ((pointer)local_a8._0_8_ != pbVar1) {
    operator_delete((void *)local_a8._0_8_);
  }
  if ((pointer)uVar5 != (pointer)0x0) {
    pcVar3 = (stats->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_a8._0_8_ = pbVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,pcVar3,
               pcVar3 + (stats->assertionResult).m_resultData.message._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os._M_head_impl,(char *)local_a8._0_8_,local_a8._8_8_);
    local_78[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os._M_head_impl,local_78,1);
    if ((pointer)local_a8._0_8_ != pbVar1) {
      operator_delete((void *)local_a8._0_8_);
    }
  }
  pMVar11 = (stats->infoMessages).
            super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pMVar4 = (stats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar11 != pMVar4) {
    do {
      if (pMVar11->type == Info) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)os._M_head_impl,(pMVar11->message)._M_dataplus._M_p,
                   (pMVar11->message)._M_string_length);
        local_a8[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)os._M_head_impl,local_a8,1);
      }
      pMVar11 = pMVar11 + 1;
    } while (pMVar11 != pMVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os._M_head_impl,"at ",3);
  local_a8._0_8_ = (stats->assertionResult).m_info.lineInfo.file;
  local_a8._8_8_ = (stats->assertionResult).m_info.lineInfo.line;
  operator<<((ostream *)os._M_head_impl,(SourceLineInfo *)local_a8);
  std::__cxx11::stringbuf::str();
  XmlWriter::writeText(this_01,(string *)local_a8,Newline);
  if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
    operator_delete((void *)local_a8._0_8_);
  }
  ReusableStringStream::~ReusableStringStream(&local_d0);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_b8);
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
LAB_00173dcc:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void JunitReporter::writeAssertion( AssertionStats const& stats ) {
        AssertionResult const& result = stats.assertionResult;
        if( !result.isOk() ) {
            std::string elementName;
            switch( result.getResultType() ) {
                case ResultWas::ThrewException:
                case ResultWas::FatalErrorCondition:
                    elementName = "error";
                    break;
                case ResultWas::ExplicitFailure:
                case ResultWas::ExpressionFailed:
                case ResultWas::DidntThrowException:
                    elementName = "failure";
                    break;

                // We should never see these here:
                case ResultWas::Info:
                case ResultWas::Warning:
                case ResultWas::Ok:
                case ResultWas::Unknown:
                case ResultWas::FailureBit:
                case ResultWas::Exception:
                    elementName = "internalError";
                    break;
            }

            XmlWriter::ScopedElement e = xml.scopedElement( elementName );

            xml.writeAttribute( "message", result.getExpression() );
            xml.writeAttribute( "type", result.getTestMacroName() );

            ReusableStringStream rss;
            if (stats.totals.assertions.total() > 0) {
                rss << "FAILED" << ":\n";
                if (result.hasExpression()) {
                    rss << "  ";
                    rss << result.getExpressionInMacro();
                    rss << '\n';
                }
                if (result.hasExpandedExpression()) {
                    rss << "with expansion:\n";
                    rss << Column(result.getExpandedExpression()).indent(2) << '\n';
                }
            } else {
                rss << '\n';
            }

            if( !result.getMessage().empty() )
                rss << result.getMessage() << '\n';
            for( auto const& msg : stats.infoMessages )
                if( msg.type == ResultWas::Info )
                    rss << msg.message << '\n';

            rss << "at " << result.getSourceInfo();
            xml.writeText( rss.str(), XmlFormatting::Newline );
        }
    }